

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset_props.cpp
# Opt level: O0

USet * uset_openPatternOptions_63
                 (UChar *pattern,int32_t patternLength,uint32_t options,UErrorCode *ec)

{
  UBool UVar1;
  UnicodeSet *this;
  UnicodeString *pattern_00;
  UnicodeSet *local_b0;
  UnicodeSet *local_88;
  UnicodeSet *set;
  ConstChar16Ptr local_70;
  undefined1 local_68 [8];
  UnicodeString pat;
  UErrorCode *ec_local;
  uint32_t options_local;
  int32_t patternLength_local;
  UChar *pattern_local;
  
  pat.fUnion._48_8_ = ec;
  icu_63::ConstChar16Ptr::ConstChar16Ptr(&local_70,pattern);
  pattern_00 = (UnicodeString *)(ulong)(patternLength == -1);
  icu_63::UnicodeString::UnicodeString
            ((UnicodeString *)local_68,patternLength == -1,&local_70,patternLength);
  icu_63::ConstChar16Ptr::~ConstChar16Ptr(&local_70);
  this = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pattern_00);
  local_b0 = (UnicodeSet *)0x0;
  if (this != (UnicodeSet *)0x0) {
    pattern_00 = (UnicodeString *)local_68;
    icu_63::UnicodeSet::UnicodeSet
              (this,pattern_00,options,(SymbolTable *)0x0,(UErrorCode *)pat.fUnion._48_8_);
    local_b0 = this;
  }
  local_88 = local_b0;
  if (local_b0 == (UnicodeSet *)0x0) {
    *(undefined4 *)pat.fUnion._48_8_ = 7;
    pattern_local = (UChar *)0x0;
  }
  else {
    UVar1 = U_FAILURE(*(UErrorCode *)pat.fUnion._48_8_);
    if (UVar1 != '\0') {
      if (local_b0 != (UnicodeSet *)0x0) {
        icu_63::UnicodeSet::~UnicodeSet(local_b0);
        icu_63::UMemory::operator_delete((UMemory *)local_b0,pattern_00);
      }
      local_88 = (UnicodeSet *)0x0;
    }
    pattern_local = (UChar *)local_88;
  }
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_68);
  return (USet *)pattern_local;
}

Assistant:

U_CAPI USet* U_EXPORT2
uset_openPatternOptions(const UChar* pattern, int32_t patternLength,
                 uint32_t options,
                 UErrorCode* ec)
{
    UnicodeString pat(patternLength==-1, pattern, patternLength);
    UnicodeSet* set = new UnicodeSet(pat, options, NULL, *ec);
    /* test for NULL */
    if(set == 0) {
        *ec = U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }

    if (U_FAILURE(*ec)) {
        delete set;
        set = NULL;
    }
    return (USet*) set;
}